

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

void __thiscall DomBrush::clear(DomBrush *this)

{
  DomProperty *this_00;
  DomGradient *this_01;
  
  operator_delete(this->m_color,0x18);
  this_00 = this->m_texture;
  if (this_00 != (DomProperty *)0x0) {
    DomProperty::~DomProperty(this_00);
  }
  operator_delete(this_00,0x178);
  this_01 = this->m_gradient;
  if (this_01 != (DomGradient *)0x0) {
    DomGradient::~DomGradient(this_01);
  }
  operator_delete(this_01,0x118);
  this->m_texture = (DomProperty *)0x0;
  this->m_gradient = (DomGradient *)0x0;
  *(undefined8 *)&this->m_kind = 0;
  *(undefined8 *)((long)&this->m_color + 4) = 0;
  return;
}

Assistant:

void DomBrush::clear()
{
    delete m_color;
    delete m_texture;
    delete m_gradient;

    m_kind = Unknown;

    m_color = nullptr;
    m_texture = nullptr;
    m_gradient = nullptr;
}